

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

double HistogramAddEval(VP8LHistogram *a,VP8LHistogram *b,VP8LHistogram *out,double cost_threshold)

{
  int iVar1;
  long in_RDX;
  double *in_RSI;
  double in_RDI;
  double in_XMM0_Qa;
  VP8LHistogram *out_00;
  VP8LHistogram *a_00;
  VP8LHistogram *unaff_retaddr;
  double sum_cost;
  double cost;
  VP8LHistogram *b_00;
  
  b_00 = (VP8LHistogram *)0x0;
  out_00 = (VP8LHistogram *)(*(double *)((long)in_RDI + 0xcb0) + in_RSI[0x196]);
  a_00 = (VP8LHistogram *)((double)out_00 + in_XMM0_Qa);
  iVar1 = GetCombinedHistogramEntropy((VP8LHistogram *)sum_cost,unaff_retaddr,in_RDI,in_RSI);
  if (iVar1 != 0) {
    HistogramAdd(a_00,b_00,out_00);
    *(VP8LHistogram **)(in_RDX + 0xcb0) = b_00;
    *(undefined4 *)(in_RDX + 0xca8) = *(undefined4 *)((long)in_RDI + 0xca8);
  }
  return (double)b_00 - (double)out_00;
}

Assistant:

static double HistogramAddEval(const VP8LHistogram* const a,
                               const VP8LHistogram* const b,
                               VP8LHistogram* const out,
                               double cost_threshold) {
  double cost = 0;
  const double sum_cost = a->bit_cost_ + b->bit_cost_;
  cost_threshold += sum_cost;

  if (GetCombinedHistogramEntropy(a, b, cost_threshold, &cost)) {
    HistogramAdd(a, b, out);
    out->bit_cost_ = cost;
    out->palette_code_bits_ = a->palette_code_bits_;
  }

  return cost - sum_cost;
}